

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.hpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::Utils::vec4<unsigned_int>::operator==
          (vec4<unsigned_int> *this,vec4<unsigned_int> *val)

{
  bool bVar1;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool result;
  vec4<unsigned_int> *val_local;
  vec4<unsigned_int> *this_local;
  
  bVar1 = compare<unsigned_int>(&this->m_x,&val->m_x);
  local_29 = false;
  if (bVar1) {
    local_29 = compare<unsigned_int>(&this->m_y,&val->m_y);
  }
  local_2a = false;
  if (local_29 != false) {
    local_2a = compare<unsigned_int>(&this->m_z,&val->m_z);
  }
  local_2b = false;
  if (local_2a != false) {
    local_2b = compare<unsigned_int>(&this->m_w,&val->m_w);
  }
  return local_2b;
}

Assistant:

bool operator==(const vec4& val) const
		{
			bool result = true;

			result = result && compare(m_x, val.m_x);
			result = result && compare(m_y, val.m_y);
			result = result && compare(m_z, val.m_z);
			result = result && compare(m_w, val.m_w);

			return result;
		}